

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

int __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
unlink(SignalLink *this,char *__name)

{
  int extraout_EAX;
  nullptr_t in_stack_ffffffffffffffe8;
  
  Catch::clara::std::function<void_(const_void_*)>::operator=
            ((function<void_(const_void_*)> *)this,in_stack_ffffffffffffffe8);
  if (this->next != (SignalLink *)0x0) {
    this->next->prev = this->prev;
  }
  if (this->prev != (SignalLink *)0x0) {
    this->prev->next = this->next;
  }
  decref(this);
  return extraout_EAX;
}

Assistant:

void unlink() {
      function = nullptr;
      if (next) next->prev = prev;
      if (prev) prev->next = next;
      decref();
      // leave intact ->next, ->prev for stale iterators
    }